

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
          (QUnicodeControlCharacterMenu *this,QObject *_editWidget,QWidget *parent)

{
  long lVar1;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QMenu::QMenu((QMenu *)this,parent);
  *(undefined ***)this = &PTR_metaObject_0080d200;
  *(undefined ***)(this + 0x10) = &PTR__QUnicodeControlCharacterMenu_0080d3b8;
  *(QObject **)(this + 0x28) = _editWidget;
  QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x6f2aea);
  QMenu::setTitle((QMenu *)this,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar1 = 0;
  do {
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,
                    (int)*(undefined8 *)((long)&qt_controlCharacters[0].text + lVar1));
    QWidget::addAction((QWidget *)this,&local_50,(QObject *)this,"1menuActionTriggered()",
                       AutoConnection);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu(QObject *_editWidget, QWidget *parent)
    : QMenu(parent), editWidget(_editWidget)
{
    setTitle(tr("Insert Unicode control character"));
    for (int i = 0; i < NUM_CONTROL_CHARACTERS; ++i) {
        addAction(tr(qt_controlCharacters[i].text), this, SLOT(menuActionTriggered()));
    }
}